

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O3

PaError PaSkeleton_Initialize(PaUtilHostApiRepresentation **hostApi,PaHostApiIndex hostApiIndex)

{
  PaUtilHostApiRepresentation *pPVar1;
  PaUtilHostApiRepresentation *pPVar2;
  PaUtilAllocationGroup *pPVar3;
  PaError PVar4;
  undefined4 in_register_00000034;
  
  pPVar2 = (PaUtilHostApiRepresentation *)
           PaUtil_AllocateMemory(0x110,CONCAT44(in_register_00000034,hostApiIndex));
  PVar4 = -0x2708;
  if (pPVar2 != (PaUtilHostApiRepresentation *)0x0) {
    pPVar3 = PaUtil_CreateAllocationGroup();
    pPVar2[3].Terminate = (_func_void_PaUtilHostApiRepresentation_ptr *)pPVar3;
    if (pPVar3 == (PaUtilAllocationGroup *)0x0) {
      PaUtil_FreeMemory(pPVar2);
    }
    else {
      *hostApi = pPVar2;
      (pPVar2->info).structVersion = 1;
      (pPVar2->info).type = paInDevelopment;
      (pPVar2->info).name = "skeleton implementation";
      pPVar1 = *hostApi;
      (pPVar1->info).defaultOutputDevice = -1;
      (pPVar1->info).deviceCount = 0;
      (pPVar1->info).defaultInputDevice = -1;
      pPVar1->Terminate = Terminate;
      (*hostApi)->OpenStream = OpenStream;
      (*hostApi)->IsFormatSupported = IsFormatSupported;
      PaUtil_InitializeStreamInterface
                ((PaUtilStreamInterface *)(pPVar2 + 1),CloseStream,StartStream,StopStream,
                 AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,GetStreamCpuLoad,
                 PaUtil_DummyRead,PaUtil_DummyWrite,PaUtil_DummyGetReadAvailable,
                 PaUtil_DummyGetWriteAvailable);
      PaUtil_InitializeStreamInterface
                ((PaUtilStreamInterface *)&pPVar2[2].info.deviceCount,CloseStream,StartStream,
                 StopStream,AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,
                 PaUtil_DummyGetCpuLoad,ReadStream,WriteStream,GetStreamReadAvailable,
                 GetStreamWriteAvailable);
      PVar4 = 0;
    }
  }
  return PVar4;
}

Assistant:

PaError PaSkeleton_Initialize( PaUtilHostApiRepresentation **hostApi, PaHostApiIndex hostApiIndex )
{
    PaError result = paNoError;
    int i, deviceCount;
    PaSkeletonHostApiRepresentation *skeletonHostApi;
    PaDeviceInfo *deviceInfoArray;

    skeletonHostApi = (PaSkeletonHostApiRepresentation*)PaUtil_AllocateMemory( sizeof(PaSkeletonHostApiRepresentation) );
    if( !skeletonHostApi )
    {
        result = paInsufficientMemory;
        goto error;
    }

    skeletonHostApi->allocations = PaUtil_CreateAllocationGroup();
    if( !skeletonHostApi->allocations )
    {
        result = paInsufficientMemory;
        goto error;
    }

    *hostApi = &skeletonHostApi->inheritedHostApiRep;
    (*hostApi)->info.structVersion = 1;
    (*hostApi)->info.type = paInDevelopment;            /* IMPLEMENT ME: change to correct type id */
    (*hostApi)->info.name = "skeleton implementation";  /* IMPLEMENT ME: change to correct name */

    (*hostApi)->info.defaultInputDevice = paNoDevice;  /* IMPLEMENT ME */
    (*hostApi)->info.defaultOutputDevice = paNoDevice; /* IMPLEMENT ME */

    (*hostApi)->info.deviceCount = 0;  

    deviceCount = 0; /* IMPLEMENT ME */
    
    if( deviceCount > 0 )
    {
        (*hostApi)->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
                skeletonHostApi->allocations, sizeof(PaDeviceInfo*) * deviceCount );
        if( !(*hostApi)->deviceInfos )
        {
            result = paInsufficientMemory;
            goto error;
        }

        /* allocate all device info structs in a contiguous block */
        deviceInfoArray = (PaDeviceInfo*)PaUtil_GroupAllocateMemory(
                skeletonHostApi->allocations, sizeof(PaDeviceInfo) * deviceCount );
        if( !deviceInfoArray )
        {
            result = paInsufficientMemory;
            goto error;
        }

        for( i=0; i < deviceCount; ++i )
        {
            PaDeviceInfo *deviceInfo = &deviceInfoArray[i];
            deviceInfo->structVersion = 2;
            deviceInfo->hostApi = hostApiIndex;
            deviceInfo->name = 0; /* IMPLEMENT ME: allocate block and copy name eg:
                deviceName = (char*)PaUtil_GroupAllocateMemory( skeletonHostApi->allocations, strlen(srcName) + 1 );
                if( !deviceName )
                {
                    result = paInsufficientMemory;
                    goto error;
                }
                strcpy( deviceName, srcName );
                deviceInfo->name = deviceName;
            */

            deviceInfo->maxInputChannels = 0;  /* IMPLEMENT ME */
            deviceInfo->maxOutputChannels = 0;  /* IMPLEMENT ME */
            
            deviceInfo->defaultLowInputLatency = 0.;  /* IMPLEMENT ME */
            deviceInfo->defaultLowOutputLatency = 0.;  /* IMPLEMENT ME */
            deviceInfo->defaultHighInputLatency = 0.;  /* IMPLEMENT ME */
            deviceInfo->defaultHighOutputLatency = 0.;  /* IMPLEMENT ME */  

            deviceInfo->defaultSampleRate = 0.; /* IMPLEMENT ME */
            
            (*hostApi)->deviceInfos[i] = deviceInfo;
            ++(*hostApi)->info.deviceCount;
        }
    }

    (*hostApi)->Terminate = Terminate;
    (*hostApi)->OpenStream = OpenStream;
    (*hostApi)->IsFormatSupported = IsFormatSupported;

    PaUtil_InitializeStreamInterface( &skeletonHostApi->callbackStreamInterface, CloseStream, StartStream,
                                      StopStream, AbortStream, IsStreamStopped, IsStreamActive,
                                      GetStreamTime, GetStreamCpuLoad,
                                      PaUtil_DummyRead, PaUtil_DummyWrite,
                                      PaUtil_DummyGetReadAvailable, PaUtil_DummyGetWriteAvailable );

    PaUtil_InitializeStreamInterface( &skeletonHostApi->blockingStreamInterface, CloseStream, StartStream,
                                      StopStream, AbortStream, IsStreamStopped, IsStreamActive,
                                      GetStreamTime, PaUtil_DummyGetCpuLoad,
                                      ReadStream, WriteStream, GetStreamReadAvailable, GetStreamWriteAvailable );

    return result;

error:
    if( skeletonHostApi )
    {
        if( skeletonHostApi->allocations )
        {
            PaUtil_FreeAllAllocations( skeletonHostApi->allocations );
            PaUtil_DestroyAllocationGroup( skeletonHostApi->allocations );
        }
                
        PaUtil_FreeMemory( skeletonHostApi );
    }
    return result;
}